

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint aom_mse8x8_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  uint *in_R8;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000018;
  uint8_t *in_stack_00000028;
  
  aom_variance8x8_sse2
            (in_stack_00000028,src._4_4_,(uint8_t *)CONCAT44(src_stride,in_stack_00000018),ref._4_4_
             ,(uint *)CONCAT44(ref_stride,in_stack_00000008));
  return *in_R8;
}

Assistant:

unsigned int aom_mse8x8_sse2(const uint8_t *src, int src_stride,
                             const uint8_t *ref, int ref_stride,
                             unsigned int *sse) {
  aom_variance8x8_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}